

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

shared_ptr<mocker::ast::IdentifierExpr> __thiscall
mocker::Parser::identifierExpr(Parser *this,TokIter *iter,TokIter end)

{
  Token *this_00;
  PosPair p;
  bool bVar1;
  element_type *this_01;
  mapped_type *pmVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<mocker::ast::IdentifierExpr> sVar4;
  NodeID local_70;
  size_t local_68;
  size_t sStack_60;
  size_t local_58;
  size_t sStack_50;
  undefined1 local_38 [8];
  shared_ptr<mocker::ast::Identifier> res;
  TokIter *iter_local;
  Parser *this_local;
  TokIter end_local;
  
  res.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)end._M_current;
  identifier((Parser *)local_38,iter,end);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if (bVar1) {
    this_00 = iter[2]._M_current;
    this_01 = std::
              __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_38);
    local_70 = ast::ASTNode::getID(&this_01->super_ASTNode);
    pmVar2 = std::
             unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
             ::operator[]((unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                           *)this_00,&local_70);
    local_68 = (pmVar2->first).line;
    sStack_60 = (pmVar2->first).col;
    local_58 = (pmVar2->second).line;
    sStack_50 = (pmVar2->second).col;
    p.first = pmVar2->first;
    p.second = pmVar2->second;
    makeNode<mocker::ast::IdentifierExpr,std::shared_ptr<mocker::ast::Identifier>&>
              (this,p,(shared_ptr<mocker::ast::Identifier> *)iter);
  }
  std::shared_ptr<mocker::ast::Identifier>::~shared_ptr
            ((shared_ptr<mocker::ast::Identifier> *)local_38);
  _Var3._M_pi = extraout_RDX;
  if (!bVar1) {
    std::shared_ptr<mocker::ast::IdentifierExpr>::shared_ptr
              ((shared_ptr<mocker::ast::IdentifierExpr> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::IdentifierExpr>)
         sVar4.super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::IdentifierExpr> Parser::identifierExpr(TokIter &iter,
                                                            TokIter end) {
  if (auto res = identifier(iter, end))
    return makeNode<ast::IdentifierExpr>(pos[res->getID()], res);
  return nullptr;
}